

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

void sei_cat(sei_t *to,sei_t *from,int itu_t_t35)

{
  sei_message_t *msg_00;
  sei_message_t *msg_01;
  int in_EDX;
  sei_t *in_RSI;
  sei_t *in_RDI;
  sei_message_t *msg;
  
  if ((in_RDI != (sei_t *)0x0) && (in_RSI != (sei_t *)0x0)) {
    for (msg_00 = sei_message_head(in_RSI); msg_00 != (sei_message_t *)0x0;
        msg_00 = sei_message_next(msg_00)) {
      if ((in_EDX != 0) || (msg_00->type != sei_type_user_data_registered_itu_t_t35)) {
        msg_01 = sei_message_copy(msg_00);
        sei_message_append(in_RDI,msg_01);
      }
    }
  }
  return;
}

Assistant:

void sei_cat(sei_t* to, sei_t* from, int itu_t_t35)
{
    if (!to || !from) {
        return;
    }

    sei_message_t* msg = NULL;
    for (msg = sei_message_head(from); msg; msg = sei_message_next(msg)) {
        if (itu_t_t35 || sei_type_user_data_registered_itu_t_t35 != msg->type) {
            sei_message_append(to, sei_message_copy(msg));
        }
    }
}